

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

int Abc_NtkFinCountPairs(Vec_Wec_t *vClasses)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)vClasses->nSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + *(int *)((long)&vClasses->pArray->nSize + lVar2) + -1;
      lVar2 = lVar2 + 0x10;
    } while ((long)vClasses->nSize * 0x10 != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Abc_NtkFinCountPairs( Vec_Wec_t * vClasses )
{
    int i, Counter = 0;
    Vec_Int_t * vLevel;
    Vec_WecForEachLevel( vClasses, vLevel, i )
        Counter += Vec_IntSize(vLevel) - 1;
    return Counter;
}